

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress,std::allocator<CAddress>>
               (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *os,
               vector<CAddress,_std::allocator<CAddress>_> *v)

{
  long in_FS_OFFSET;
  vector<CAddress,_std::allocator<CAddress>_> *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = v;
  Wrapper<VectorFormatter<DefaultFormatter>,std::vector<CAddress,std::allocator<CAddress>>const&>::
  Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
            ((Wrapper<VectorFormatter<DefaultFormatter>,std::vector<CAddress,std::allocator<CAddress>>const&>
              *)&local_10,os);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        WriteCompactSize(os, v.size());
        if (!v.empty()) os.write(MakeByteSpan(v));
    } else if constexpr (std::is_same_v<T, bool>) {
        // A special case for std::vector<bool>, as dereferencing
        // std::vector<bool>::const_iterator does not result in a const bool&
        // due to std::vector's special casing for bool arguments.
        WriteCompactSize(os, v.size());
        for (bool elem : v) {
            ::Serialize(os, elem);
        }
    } else {
        Serialize(os, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}